

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

void aom_highbd_quantize_b_helper_c
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  byte bVar8;
  long in_RCX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  void *in_stack_00000008;
  void *in_stack_00000010;
  tran_low_t abs_dqcoeff;
  int abs_qcoeff;
  int64_t tmp2;
  int64_t tmpw;
  int64_t tmp1;
  long in_stack_00000038;
  int abs_coeff;
  qm_val_t iwt;
  qm_val_t wt_1;
  long in_stack_00000040;
  int coeff_sign;
  int coeff_1;
  int rc_1;
  int coeff;
  qm_val_t wt;
  int rc;
  int idx;
  int idx_arr [4096];
  int dequant;
  int nzbins [2];
  int zbins [2];
  int eob;
  int i;
  int local_405c;
  int aiStack_4058 [4100];
  int local_48 [4];
  int local_38;
  int local_34;
  long local_30;
  long local_28;
  long local_20;
  long local_10;
  long local_8;
  
  local_38 = -1;
  bVar8 = (byte)coeff_1;
  local_48[2] = (int)*in_RDX + ((1 << (bVar8 & 0x1f)) >> 1) >> (bVar8 & 0x1f);
  local_48[3] = (int)in_RDX[1] + ((1 << (bVar8 & 0x1f)) >> 1) >> (bVar8 & 0x1f);
  local_48[0] = -local_48[2];
  local_48[1] = -local_48[3];
  local_405c = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(in_stack_00000008,0,in_RSI << 2);
  memset(in_stack_00000010,0,local_10 << 2);
  for (local_34 = 0; local_34 < local_10; local_34 = local_34 + 1) {
    iVar3 = (int)*(short *)(tmpw + (long)local_34 * 2);
    if (in_stack_00000038 == 0) {
      bVar1 = 0x20;
    }
    else {
      bVar1 = *(byte *)(in_stack_00000038 + iVar3);
    }
    iVar4 = *(int *)(local_8 + (long)iVar3 * 4) * (uint)bVar1;
    if ((local_48[(long)(int)(uint)(iVar3 != 0) + 2] * 0x20 <= iVar4) ||
       (iVar4 <= local_48[(int)(uint)(iVar3 != 0)] * 0x20)) {
      aiStack_4058[local_405c] = local_34;
      local_405c = local_405c + 1;
    }
  }
  for (local_34 = 0; local_34 < local_405c; local_34 = local_34 + 1) {
    iVar3 = (int)*(short *)(tmpw + (long)aiStack_4058[local_34] * 2);
    uVar6 = *(uint *)(local_8 + (long)iVar3 * 4);
    uVar5 = 0;
    if ((int)uVar6 < 0) {
      uVar5 = 0xffffffff;
    }
    if (in_stack_00000038 == 0) {
      bVar1 = 0x20;
    }
    else {
      bVar1 = *(byte *)(in_stack_00000038 + iVar3);
    }
    if (in_stack_00000040 == 0) {
      bVar2 = 0x20;
    }
    else {
      bVar2 = *(byte *)(in_stack_00000040 + iVar3);
    }
    lVar7 = (long)(int)(((uVar6 ^ uVar5) - uVar5) +
                       ((int)*(short *)(local_20 + (long)(int)(uint)(iVar3 != 0) * 2) +
                        ((1 << (bVar8 & 0x1f)) >> 1) >> (bVar8 & 0x1f))) * (ulong)bVar1;
    uVar6 = (uint)(((lVar7 * *(short *)(local_28 + (long)(int)(uint)(iVar3 != 0) * 2) >> 0x10) +
                   lVar7) * (long)*(short *)(local_30 + (long)(int)(uint)(iVar3 != 0) * 2) >>
                  (0x15 - bVar8 & 0x3f));
    *(uint *)((long)in_stack_00000008 + (long)iVar3 * 4) = (uVar6 ^ uVar5) - uVar5;
    *(uint *)((long)in_stack_00000010 + (long)iVar3 * 4) =
         ((int)(uVar6 * ((int)((int)*(short *)(_abs_dqcoeff + (long)(int)(uint)(iVar3 != 0) * 2) *
                               (uint)bVar2 + 0x10) >> 5)) >> (bVar8 & 0x1f) ^ uVar5) - uVar5;
    if (uVar6 != 0) {
      local_38 = aiStack_4058[local_34];
    }
  }
  *(short *)tmp2 = (short)local_38 + 1;
  return;
}

Assistant:

void aom_highbd_quantize_b_helper_c(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, const qm_val_t *qm_ptr,
    const qm_val_t *iqm_ptr, const int log_scale) {
  int i, eob = -1;
  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  const int nzbins[2] = { zbins[0] * -1, zbins[1] * -1 };
  int dequant;
  int idx_arr[4096];
  (void)iscan;
  int idx = 0;

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  // Pre-scan pass
  for (i = 0; i < n_coeffs; i++) {
    const int rc = scan[i];
    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    const int coeff = coeff_ptr[rc] * wt;

    // If the coefficient is out of the base ZBIN range, keep it for
    // quantization.
    if (coeff >= (zbins[rc != 0] * (1 << AOM_QM_BITS)) ||
        coeff <= (nzbins[rc != 0] * (1 << AOM_QM_BITS)))
      idx_arr[idx++] = i;
  }

  // Quantization pass: only process the coefficients selected in
  // pre-scan pass. Note: idx can be zero.
  for (i = 0; i < idx; i++) {
    const int rc = scan[idx_arr[i]];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    const qm_val_t iwt = iqm_ptr != NULL ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    const int64_t tmp1 =
        abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], log_scale);
    const int64_t tmpw = tmp1 * wt;
    const int64_t tmp2 = ((tmpw * quant_ptr[rc != 0]) >> 16) + tmpw;
    const int abs_qcoeff = (int)((tmp2 * quant_shift_ptr[rc != 0]) >>
                                 (16 - log_scale + AOM_QM_BITS));
    qcoeff_ptr[rc] = (tran_low_t)((abs_qcoeff ^ coeff_sign) - coeff_sign);
    dequant =
        (dequant_ptr[rc != 0] * iwt + (1 << (AOM_QM_BITS - 1))) >> AOM_QM_BITS;
    const tran_low_t abs_dqcoeff = (abs_qcoeff * dequant) >> log_scale;
    dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);
    if (abs_qcoeff) eob = idx_arr[i];
  }
  *eob_ptr = eob + 1;
}